

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  locale l1;
  locale l2;
  string name;
  generator gen;
  localization_backend_manager mgr;
  locale l2_4;
  locale l1_4;
  string real_name;
  string local_288;
  char *local_268;
  long local_260;
  char local_258 [16];
  string local_248;
  generator local_228 [8];
  string local_220 [16];
  locale local_210 [8];
  string local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  locale local_1d8 [8];
  localization_backend_manager local_1d0 [8];
  string local_1c8 [3];
  ios_base local_158 [264];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  booster::locale::localization_backend_manager::global();
  paVar3 = &local_1c8[0].field_2;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"std","");
  booster::locale::localization_backend_manager::select(local_220,(uint)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  booster::locale::localization_backend_manager::global(local_1d0);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_1d0);
  booster::locale::generator::generator(local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"en_US.UTF locale",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_1c8[0]._M_string_length = 0;
  local_1c8[0].field_2._M_local_buf[0] = '\0';
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"en_US.UTF-8","");
  get_std_name(&local_248,&local_288,local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_248._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"en_US.UTF-8 not supported",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    booster::locale::generator::generate((string *)&local_288);
    std::locale::locale((locale *)&local_268,local_1c8[0]._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UTF-8",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (local_248._M_string_length == local_1c8[0]._M_string_length) {
      if (local_248._M_string_length != 0) {
        iVar4 = bcmp(local_248._M_dataplus._M_p,local_1c8[0]._M_dataplus._M_p,
                     local_248._M_string_length);
        if (iVar4 != 0) goto LAB_0010598f;
      }
      test_by_char<char,char>((locale *)&local_288,(locale *)&local_268);
    }
    else {
LAB_0010598f:
      test_by_char<char,wchar_t>((locale *)&local_288,(locale *)&local_268);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wide UTF-",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    test_by_char<wchar_t,wchar_t>((locale *)&local_288,(locale *)&local_268);
    std::locale::~locale((locale *)&local_268);
    std::locale::~locale((locale *)&local_288);
  }
  paVar2 = &local_248.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"en_US.Latin-1 locale",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_1c8[0]._M_string_length = 0;
  local_1c8[0].field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)paVar1;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"en_US.ISO8859-1","");
  get_std_name(&local_248,&local_288,local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_248._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"en_US.ISO8859-8 not supported",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    booster::locale::generator::generate((string *)&local_288);
    std::locale::locale((locale *)&local_268,local_1c8[0]._M_dataplus._M_p);
    test_by_char<char,char>((locale *)&local_288,(locale *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wide UTF-",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    test_by_char<wchar_t,wchar_t>((locale *)&local_288,(locale *)&local_268);
    std::locale::~locale((locale *)&local_268);
    std::locale::~locale((locale *)&local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"he_IL.UTF locale",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_1c8[0]._M_string_length = 0;
  local_1c8[0].field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)paVar1;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"he_IL.UTF-8","");
  get_std_name(&local_248,&local_288,local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_248._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"he_IL.UTF-8 not supported",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    booster::locale::generator::generate((string *)&local_288);
    std::locale::locale((locale *)&local_268,local_1c8[0]._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UTF-8",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (local_248._M_string_length == local_1c8[0]._M_string_length) {
      if (local_248._M_string_length != 0) {
        iVar4 = bcmp(local_248._M_dataplus._M_p,local_1c8[0]._M_dataplus._M_p,
                     local_248._M_string_length);
        if (iVar4 != 0) goto LAB_00105d7e;
      }
      test_by_char<char,char>((locale *)&local_288,(locale *)&local_268);
    }
    else {
LAB_00105d7e:
      test_by_char<char,wchar_t>((locale *)&local_288,(locale *)&local_268);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wide UTF-",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    test_by_char<wchar_t,wchar_t>((locale *)&local_288,(locale *)&local_268);
    std::locale::~locale((locale *)&local_268);
    std::locale::~locale((locale *)&local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"he_IL.ISO8859-8 locale",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_1c8[0]._M_string_length = 0;
  local_1c8[0].field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)paVar1;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"he_IL.ISO8859-8","");
  get_std_name(&local_248,&local_288,local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_248._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"he_IL.ISO8859-8 not supported",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    booster::locale::generator::generate((string *)&local_288);
    std::locale::locale((locale *)&local_268,local_1c8[0]._M_dataplus._M_p);
    test_by_char<char,char>((locale *)&local_288,(locale *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wide UTF-",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    test_by_char<wchar_t,wchar_t>((locale *)&local_288,(locale *)&local_268);
    std::locale::~locale((locale *)&local_268);
    std::locale::~locale((locale *)&local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing UTF-8 punct workaround",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)paVar2;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"ru_RU.UTF-8","");
  get_std_name(&local_288,local_1c8,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  if (local_288._M_string_length == 0) {
    lVar6 = 0x13;
    pcVar7 = "- No russian locale";
  }
  else {
    lVar6 = 0x31;
    pcVar7 = "- Not having UTF-8 locale, no need for workaround";
    if (local_288._M_string_length == local_248._M_string_length) {
      iVar4 = bcmp(local_288._M_dataplus._M_p,local_248._M_dataplus._M_p,local_288._M_string_length)
      ;
      if (iVar4 == 0) {
        booster::locale::generator::generate(local_208);
        std::locale::locale(local_210,local_248._M_dataplus._M_p);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ios::imbue(local_1d8);
        std::locale::~locale(local_1d8);
        std::ostream::_M_insert<double>(12345.45);
        std::__cxx11::stringbuf::str();
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"windows-1251","");
        booster::locale::conv::from_utf<char>
                  ((char *)local_50,local_268,(string *)(local_268 + local_260),
                   (method_type)local_1f8);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0]);
        }
        if (local_268 != local_258) {
          operator_delete(local_268);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- No invalid UTF. No need to check",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        std::locale::~locale(local_210);
        std::locale::~locale((locale *)local_208);
        goto LAB_001062e9;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
LAB_001062e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  booster::locale::generator::~generator(local_228);
  booster::locale::localization_backend_manager::~localization_backend_manager
            ((localization_backend_manager *)local_220);
  iVar4 = test_counter - error_counter;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (0 < error_counter) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed ",7);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,error_counter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," tests",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  lVar6 = std::cout;
  *(uint *)(booster::locale::ios_info::get + *(long *)(std::cout + -0x18)) =
       *(uint *)(booster::locale::ios_info::get + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar6 + -0x18)) = 1;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar6 + -0x18)) = 5;
  poVar5 = std::ostream::_M_insert<double>(((double)iVar4 * 100.0) / (double)test_counter);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"% of tests completed sucsessefully",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("std");
        booster::locale::localization_backend_manager::global(mgr);
        booster::locale::generator gen;

        {
            std::cout << "en_US.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "en_US.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "en_US.Latin-1 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("en_US.ISO8859-1",&real_name);
            if(name.empty()) {
                std::cout << "en_US.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.UTF locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.UTF-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                std::cout << "UTF-8" << std::endl;
                if(name==real_name) 
                    test_by_char<char,char>(l1,l2);
                else
                    test_by_char<char,wchar_t>(l1,l2);
                
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "he_IL.ISO8859-8 locale" << std::endl;
            std::string real_name;
            std::string name = get_std_name("he_IL.ISO8859-8",&real_name);
            if(name.empty()) {
                std::cout << "he_IL.ISO8859-8 not supported" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                test_by_char<char,char>(l1,l2);
                std::cout << "Wide UTF-" << sizeof(wchar_t) * 8 << std::endl;
                test_by_char<wchar_t,wchar_t>(l1,l2);

                #ifdef BOOSTER_HAS_CHAR16_T
                std::cout << "char16 UTF-16" << std::endl;
                test_by_char<char16_t,char16_t>(l1,l2);
                #endif
                #ifdef BOOSTER_HAS_CHAR32_T
                std::cout << "char32 UTF-32" << std::endl;
                test_by_char<char32_t,char32_t>(l1,l2);
                #endif
            }
        }
        {
            std::cout << "Testing UTF-8 punct workaround" << std::endl;
            std::string real_name;
            std::string name = get_std_name("ru_RU.UTF-8",&real_name);
            if(name.empty()) {
                std::cout << "- No russian locale" << std::endl;
            }
            else if(name != real_name) {
                std::cout << "- Not having UTF-8 locale, no need for workaround" << std::endl;
            }
            else {
                std::locale l1=gen(name),l2(real_name.c_str());
                bool fails = false;
                try {
                    std::ostringstream ss;
                    ss.imbue(l2);
                    ss << 12345.45;
                    booster::locale::conv::from_utf<char>(ss.str(),"windows-1251",booster::locale::conv::stop);
                    fails = false;
                }
                catch(...) {
                    fails = true;
                }
                
                if(!fails) {
                    std::cout << "- No invalid UTF. No need to check"<<std::endl;
                }
                else {
                    std::ostringstream ss;
                    ss.imbue(l1);
                    ss << std::setprecision(10) ;
                    ss << booster::locale::as::number << 12345.45;
                    TEST(ss.str() == "12 345,45" || ss.str()=="12345,45");
                }
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}